

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

char * al_get_path_basename(ALLEGRO_PATH *path)

{
  int iVar1;
  ALLEGRO_USTR *in_RDI;
  int32_t unaff_retaddr;
  int unaff_retaddr_00;
  ALLEGRO_USTR *in_stack_00000008;
  int dot;
  uchar *puVar2;
  undefined4 in_stack_ffffffffffffffe8;
  char *local_8;
  
  puVar2 = in_RDI->data;
  al_ustr_size((ALLEGRO_USTR *)in_RDI->data);
  iVar1 = al_ustr_rfind_chr(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  if (iVar1 < 0) {
    local_8 = al_cstr((ALLEGRO_USTR *)in_RDI->data);
  }
  else {
    al_ustr_assign_substr
              (in_RDI,(ALLEGRO_USTR *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),
               (int)((ulong)puVar2 >> 0x20),(int)puVar2);
    local_8 = al_cstr(*(ALLEGRO_USTR **)(in_RDI + 3));
  }
  return local_8;
}

Assistant:

const char *al_get_path_basename(const ALLEGRO_PATH *path)
{
   int dot;
   ASSERT(path);

   dot = al_ustr_rfind_chr(path->filename, al_ustr_size(path->filename), '.');
   if (dot >= 0) {
      al_ustr_assign_substr(path->basename, path->filename, 0, dot);
      return al_cstr(path->basename);
   }

   return al_cstr(path->filename);
}